

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SegReaderCursorAppend(Fts3MultiSegReader *pCsr,Fts3SegReader *pNew)

{
  int iVar1;
  Fts3SegReader **ppFVar2;
  sqlite3_int64 nByte;
  Fts3SegReader **apNew;
  Fts3SegReader *pNew_local;
  Fts3MultiSegReader *pCsr_local;
  
  if (pCsr->nSegment % 0x10 == 0) {
    ppFVar2 = (Fts3SegReader **)
              sqlite3_realloc64(pCsr->apSegment,(long)(pCsr->nSegment + 0x10) << 3);
    if (ppFVar2 == (Fts3SegReader **)0x0) {
      sqlite3Fts3SegReaderFree(pNew);
      return 7;
    }
    pCsr->apSegment = ppFVar2;
  }
  iVar1 = pCsr->nSegment;
  pCsr->nSegment = iVar1 + 1;
  pCsr->apSegment[iVar1] = pNew;
  return 0;
}

Assistant:

static int fts3SegReaderCursorAppend(
  Fts3MultiSegReader *pCsr, 
  Fts3SegReader *pNew
){
  if( (pCsr->nSegment%16)==0 ){
    Fts3SegReader **apNew;
    sqlite3_int64 nByte = (pCsr->nSegment + 16)*sizeof(Fts3SegReader*);
    apNew = (Fts3SegReader **)sqlite3_realloc64(pCsr->apSegment, nByte);
    if( !apNew ){
      sqlite3Fts3SegReaderFree(pNew);
      return SQLITE_NOMEM;
    }
    pCsr->apSegment = apNew;
  }
  pCsr->apSegment[pCsr->nSegment++] = pNew;
  return SQLITE_OK;
}